

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall spoa::Graph::TopologicalSort(Graph *this)

{
  uint uVar1;
  Node *pNVar2;
  pointer ppEVar3;
  pointer ppNVar4;
  bool bVar5;
  _Elt_pointer ppNVar6;
  ulong uVar7;
  Edge **jt;
  pointer ppEVar8;
  pointer puVar9;
  Node **jt_1;
  pointer ppNVar10;
  value_type curr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> marks;
  stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
  stack;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  Graph *local_c0;
  _Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> local_b8;
  pointer local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  ppNVar10 = (this->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->rank_to_node_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar10) {
    (this->rank_to_node_).
    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar10;
  }
  local_b8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_b8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_d8,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type_conflict2 *)&local_b8,
             (allocator_type *)&local_58);
  local_b8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_b8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_b8,
             (allocator_type *)&local_e0);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::_M_initialize_map
            (&local_b8,0);
  local_60 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  puVar9 = (this->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = this;
  if (puVar9 != local_60) {
    do {
      pNVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
               _M_t.
               super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
               super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
      if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[pNVar2->id] == '\0') {
        local_e0._M_head_impl = pNVar2;
        std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
        emplace_back<spoa::Graph::Node*>
                  ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&local_b8,
                   &local_e0._M_head_impl);
LAB_00108843:
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00108819;
        ppNVar6 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppNVar6 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_e0._M_head_impl = ppNVar6[-1];
        uVar7 = (ulong)(local_e0._M_head_impl)->id;
        if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] != '\x02') {
          ppEVar8 = ((local_e0._M_head_impl)->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppEVar3 = ((local_e0._M_head_impl)->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          bVar5 = true;
          if (ppEVar8 != ppEVar3) {
            do {
              pNVar2 = (*ppEVar8)->tail;
              if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[pNVar2->id] != '\x02') {
                if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  _M_push_back_aux<spoa::Graph::Node*const&>
                            ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &local_b8,&(*ppEVar8)->tail);
                }
                else {
                  *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = pNVar2;
                  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                bVar5 = false;
              }
              ppEVar8 = ppEVar8 + 1;
            } while (ppEVar8 != ppEVar3);
            uVar7 = (ulong)(local_e0._M_head_impl)->id;
          }
          if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
            ppNVar4 = ((local_e0._M_head_impl)->aligned_nodes).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (ppNVar10 = ((local_e0._M_head_impl)->aligned_nodes).
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppNVar10 != ppNVar4;
                ppNVar10 = ppNVar10 + 1) {
              if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[(*ppNVar10)->id] != '\x02') {
                if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  _M_push_back_aux<spoa::Graph::Node*const&>
                            ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &local_b8,ppNVar10);
                }
                else {
                  *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = *ppNVar10;
                  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                bVar5 = false;
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[(*ppNVar10)->id >> 6] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(*ppNVar10)->id >> 6] | 1L << ((ulong)(*ppNVar10)->id & 0x3f);
              }
            }
          }
          uVar1 = (local_e0._M_head_impl)->id;
          if (!bVar5) {
            if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1] == '\x01') {
              __assert_fail("(is_valid || marks[curr->id] != 1) && \"Graph is not a DAG\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp"
                            ,0x119,"void spoa::Graph::TopologicalSort()");
            }
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar1] = '\x01';
            goto LAB_00108843;
          }
          local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1] = '\x02';
          if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[(local_e0._M_head_impl)->id >> 6] >>
               ((ulong)(local_e0._M_head_impl)->id & 0x3f) & 1) == 0) {
            std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
            emplace_back<spoa::Graph::Node*&>
                      ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                       &this->rank_to_node_,&local_e0._M_head_impl);
            ppNVar10 = ((local_e0._M_head_impl)->aligned_nodes).
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppNVar4 = ((local_e0._M_head_impl)->aligned_nodes).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppNVar10 != ppNVar4) {
              do {
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*const&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &this->rank_to_node_,ppNVar10);
                ppNVar10 = ppNVar10 + 1;
              } while (ppNVar10 != ppNVar4);
              if (bVar5) goto LAB_0010893f;
              goto LAB_00108843;
            }
          }
        }
LAB_0010893f:
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        goto LAB_00108843;
      }
LAB_00108819:
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_60);
  }
  bVar5 = IsTopologicallySorted(local_c0);
  if (!bVar5) {
    __assert_fail("IsTopologicallySorted() && \"Graph is not topologically sorted\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp",
                  0x12e,"void spoa::Graph::TopologicalSort()");
  }
  std::_Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::~_Deque_base
            (&local_b8);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Graph::TopologicalSort() {
  rank_to_node_.clear();

  std::vector<std::uint8_t> marks(nodes_.size(), 0);
  std::vector<bool> ignored(nodes_.size(), 0);

  std::stack<Node*> stack;
  for (const auto& it : nodes_) {
    if (marks[it->id] != 0) {
      continue;
    }
    stack.push(it.get());
    while (!stack.empty()) {
      auto curr = stack.top();
      bool is_valid = true;
      if (marks[curr->id] != 2) {
        for (const auto& jt : curr->inedges) {
          if (marks[jt->tail->id] != 2) {
            stack.push(jt->tail);
            is_valid = false;
          }
        }
        if (!ignored[curr->id]) {
          for (const auto& jt : curr->aligned_nodes) {
            if (marks[jt->id] != 2) {
              stack.push(jt);
              ignored[jt->id] = true;
              is_valid = false;
            }
          }
        }

        assert((is_valid || marks[curr->id] != 1) && "Graph is not a DAG");

        if (is_valid) {
          marks[curr->id] = 2;
          if (!ignored[curr->id]) {
            rank_to_node_.emplace_back(curr);
            for (const auto& jt : curr->aligned_nodes) {
              rank_to_node_.emplace_back(jt);
            }
          }
        } else {
          marks[curr->id] = 1;
        }
      }

      if (is_valid) {
        stack.pop();
      }
    }
  }

  assert(IsTopologicallySorted() && "Graph is not topologically sorted");
}